

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  RepeatedField<int> *pRVar1;
  ulong uVar2;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar3;
  int iVar4;
  undefined8 *puVar5;
  char *failure_msg;
  char *file;
  bool bVar6;
  LogMessageFatal local_30;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
            (&(this->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
            (&(this->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
            (&(this->field_0)._impl_.service_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
            (&(this->field_0)._impl_.extension_.super_RepeatedPtrFieldBase);
  pRVar1 = &(this->field_0)._impl_.public_dependency_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x80);
  if ((uVar2 & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = (uVar2 & 4) == 0;
  internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.weak_dependency_;
  uVar2 = *(ulong *)((long)&this->field_0 + 0x90);
  if ((uVar2 & 4) != 0) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar6 = (uVar2 & 4) == 0;
  internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  iVar4 = internal::SooRep::size(&pRVar1->soo_rep_,bVar6);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  RepeatedField<int>::set_size(pRVar1,(uVar2 & 4) == 0,0);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.option_dependency_.super_RepeatedPtrFieldBase);
  aVar3 = this->field_0;
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x1f) == (undefined1  [232])0x0)
  goto LAB_0020b171;
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x1) != (undefined1  [232])0x0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0xb8);
    if ((uVar2 & 3) != 0) {
      puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      puVar5[1] = 0;
      *(undefined1 *)*puVar5 = 0;
      goto LAB_0020b0f9;
    }
LAB_0020b1a1:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    iVar4 = 0x20b;
LAB_0020b1f6:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,file,iVar4,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
LAB_0020b0f9:
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x2) != (undefined1  [232])0x0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 0xc0);
    if ((uVar2 & 3) == 0) goto LAB_0020b1a1;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    puVar5[1] = 0;
    *(undefined1 *)*puVar5 = 0;
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
    uVar2 = *(ulong *)((long)&this->field_0 + 200);
    if ((uVar2 & 3) == 0) goto LAB_0020b1a1;
    puVar5 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    puVar5[1] = 0;
    *(undefined1 *)*puVar5 = 0;
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
    this_00 = (this->field_0)._impl_.options_;
    if (this_00 == (FileOptions *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
      ;
      failure_msg = "_impl_.options_ != nullptr";
      iVar4 = 0xb39;
      goto LAB_0020b1f6;
    }
    FileOptions::Clear(this_00);
  }
  if (((undefined1  [232])aVar3 & (undefined1  [232])0x10) != (undefined1  [232])0x0) {
    this_01 = (this->field_0)._impl_.source_code_info_;
    if (this_01 == (SourceCodeInfo *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
      ;
      failure_msg = "_impl_.source_code_info_ != nullptr";
      iVar4 = 0xb3d;
      goto LAB_0020b1f6;
    }
    SourceCodeInfo::Clear(this_01);
  }
LAB_0020b171:
  (this->field_0)._impl_.edition_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.dependency_.Clear();
  _impl_.message_type_.Clear();
  _impl_.enum_type_.Clear();
  _impl_.service_.Clear();
  _impl_.extension_.Clear();
  _impl_.public_dependency_.Clear();
  _impl_.weak_dependency_.Clear();
  _impl_.option_dependency_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.syntax_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.source_code_info_ != nullptr);
      _impl_.source_code_info_->Clear();
    }
  }
  _impl_.edition_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}